

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

SUNErrCode
N_VLinearCombinationVectorArray(int nvec,int nsum,sunrealtype *c,N_Vector **X,N_Vector *Z)

{
  void *__ptr;
  long *in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  int in_EDI;
  long *in_R8;
  undefined8 in_R9;
  N_Vector *Y;
  int ier;
  int j;
  int i;
  int local_2c;
  int local_28;
  int local_24;
  
  if (*(long *)(*(long *)(*in_R8 + 8) + 0x138) == 0) {
    if (*(long *)(*(long *)(*in_R8 + 8) + 0xf0) == 0) {
      for (local_24 = 0; local_24 < in_EDI; local_24 = local_24 + 1) {
        (**(code **)(*(long *)(*in_R8 + 8) + 0x78))
                  (*in_RDX,*(undefined8 *)(*in_RCX + (long)local_24 * 8),in_R8[local_24]);
        for (local_28 = 1; local_28 < in_ESI; local_28 = local_28 + 1) {
          (**(code **)(*(long *)(*in_R8 + 8) + 0x58))
                    (in_RDX[local_28],0x3ff0000000000000,
                     *(undefined8 *)(in_RCX[local_28] + (long)local_24 * 8),in_R8[local_24],
                     in_R8[local_24]);
        }
      }
      local_2c = 0;
    }
    else {
      __ptr = malloc((long)in_ESI << 3);
      for (local_24 = 0; local_24 < in_EDI; local_24 = local_24 + 1) {
        for (local_28 = 0; local_28 < in_ESI; local_28 = local_28 + 1) {
          *(undefined8 *)((long)__ptr + (long)local_28 * 8) =
               *(undefined8 *)(in_RCX[local_28] + (long)local_24 * 8);
        }
        local_2c = (**(code **)(*(long *)(*in_R8 + 8) + 0xf0))(in_ESI,in_RDX,__ptr,in_R8[local_24]);
        if (local_2c != 0) break;
      }
      free(__ptr);
    }
  }
  else {
    local_2c = (**(code **)(*(long *)(*in_R8 + 8) + 0x138))
                         (in_EDI,in_ESI,in_RDX,in_RCX,in_R8,in_R9,0);
  }
  return local_2c;
}

Assistant:

SUNErrCode N_VLinearCombinationVectorArray(int nvec, int nsum, sunrealtype* c,
                                           N_Vector** X, N_Vector* Z)
{
  int i, j, ier;
  N_Vector* Y = NULL;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(X[0][0]));

  if (Z[0]->ops->nvlinearcombinationvectorarray != NULL)
  {
    ier = Z[0]->ops->nvlinearcombinationvectorarray(nvec, nsum, c, X, Z);
  }
  else if (Z[0]->ops->nvlinearcombination != NULL)
  {
    /* allocate array of vectors */
    Y = (N_Vector*)malloc(nsum * sizeof(N_Vector));

    for (i = 0; i < nvec; i++)
    {
      for (j = 0; j < nsum; j++) { Y[j] = X[j][i]; }

      ier = Z[0]->ops->nvlinearcombination(nsum, c, Y, Z[i]);
      if (ier != 0) { break; }
    }

    /* free array of vectors */
    free(Y);
  }
  else
  {
    for (i = 0; i < nvec; i++)
    {
      Z[0]->ops->nvscale(c[0], X[0][i], Z[i]);
      for (j = 1; j < nsum; j++)
      {
        Z[0]->ops->nvlinearsum(c[j], X[j][i], SUN_RCONST(1.0), Z[i], Z[i]);
      }
    }
    ier = SUN_SUCCESS;
  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(X[0][0]));
  return (ier);
}